

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O0

char * u_strToUTF8WithSub_63
                 (char *dest,int32_t destCapacity,int32_t *pDestLength,UChar *pSrc,int32_t srcLength
                 ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  UChar UVar1;
  UBool UVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  UChar *pUVar6;
  byte *pbVar7;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  uint32_t local_b0;
  uint32_t local_ac;
  uint32_t local_a8;
  uint32_t local_a4;
  UChar *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_80;
  uint32_t local_7c;
  uint8_t *local_78;
  int local_6c;
  int32_t length_1;
  int32_t count;
  UChar *pSrcLimit;
  int32_t length;
  int32_t numSubstitutions;
  uint8_t *pDestLimit;
  uint8_t *pDest;
  uint local_40;
  uint32_t ch2;
  uint32_t ch;
  int32_t reqLength;
  UChar32 subchar_local;
  int32_t srcLength_local;
  UChar *pSrc_local;
  int32_t *pDestLength_local;
  int32_t destCapacity_local;
  char *dest_local;
  
  ch2 = 0;
  if (dest == (char *)0x0) {
    local_78 = (uint8_t *)0x0;
  }
  else {
    local_78 = (uint8_t *)(dest + destCapacity);
  }
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 != '\0') {
    return (char *)0x0;
  }
  if (((((pSrc == (UChar *)0x0) && (srcLength != 0)) || (srcLength < -1)) || (destCapacity < 0)) ||
     (((dest == (char *)0x0 && (0 < destCapacity)) ||
      ((0x10ffff < subchar || ((subchar & 0xfffff800U) == 0xd800)))))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (char *)0x0;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = 0;
  }
  pSrcLimit._4_4_ = 0;
  pDestLimit = (uint8_t *)dest;
  _subchar_local = pSrc;
  if (srcLength != -1) {
    pDestLimit = (uint8_t *)dest;
    _subchar_local = pSrc;
    if (pSrc == (UChar *)0x0) {
      local_a0 = (UChar *)0x0;
    }
    else {
      local_a0 = pSrc + srcLength;
    }
    do {
      local_6c = (int)(((long)local_78 - (long)pDestLimit) / 3);
      iVar5 = (int)((long)local_a0 - (long)_subchar_local >> 1);
      if (iVar5 < local_6c) {
        local_6c = iVar5;
      }
      if (local_6c < 3) goto LAB_003aab66;
      do {
        pUVar6 = _subchar_local + 1;
        UVar1 = *_subchar_local;
        uVar4 = (uint)(ushort)UVar1;
        bVar3 = (byte)UVar1;
        if (uVar4 < 0x80) {
          *pDestLimit = bVar3;
          pDestLimit = pDestLimit + 1;
          _subchar_local = pUVar6;
        }
        else if (uVar4 < 0x800) {
          pbVar7 = pDestLimit + 1;
          *pDestLimit = (byte)((ushort)UVar1 >> 6) | 0xc0;
          pDestLimit = pDestLimit + 2;
          *pbVar7 = bVar3 & 0x3f | 0x80;
          _subchar_local = pUVar6;
        }
        else if ((uVar4 < 0xd800) || (0xdfff < uVar4)) {
          *pDestLimit = (byte)((ushort)UVar1 >> 0xc) | 0xe0;
          pbVar7 = pDestLimit + 2;
          pDestLimit[1] = (byte)((ushort)UVar1 >> 6) & 0x3f | 0x80;
          pDestLimit = pDestLimit + 3;
          *pbVar7 = bVar3 & 0x3f | 0x80;
          _subchar_local = pUVar6;
        }
        else {
          local_6c = local_6c + -1;
          if (local_6c == 0) break;
          if (((UVar1 & 0x400U) == 0) && (((ushort)*pUVar6 & 0xfffffc00) == 0xdc00)) {
            uVar4 = uVar4 * 0x400 + (uint)(ushort)*pUVar6 + 0xfca02400;
            *pDestLimit = (byte)(uVar4 >> 0x12) | 0xf0;
            pDestLimit[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
            pbVar7 = pDestLimit + 3;
            pDestLimit[2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
            pDestLimit = pDestLimit + 4;
            *pbVar7 = (byte)uVar4 & 0x3f | 0x80;
            _subchar_local = _subchar_local + 2;
          }
          else {
            if (subchar < 0) {
              *pErrorCode = U_INVALID_CHAR_FOUND;
              return (char *)0x0;
            }
            pSrcLimit._4_4_ = pSrcLimit._4_4_ + 1;
            pDestLimit = _appendUTF8(pDestLimit,subchar);
            _subchar_local = pUVar6;
          }
        }
        local_6c = local_6c + -1;
      } while (0 < local_6c);
    } while( true );
  }
  while( true ) {
    UVar1 = *_subchar_local;
    uVar4 = (uint)(ushort)UVar1;
    if (uVar4 == 0) break;
    pUVar6 = _subchar_local + 1;
    bVar3 = (byte)UVar1;
    if (uVar4 < 0x80) {
      if (local_78 <= pDestLimit) {
        ch2 = 1;
        _subchar_local = pUVar6;
        break;
      }
      *pDestLimit = bVar3;
      pDestLimit = pDestLimit + 1;
      _subchar_local = pUVar6;
    }
    else if (uVar4 < 0x800) {
      if ((long)local_78 - (long)pDestLimit < 2) {
        ch2 = 2;
        _subchar_local = pUVar6;
        break;
      }
      pbVar7 = pDestLimit + 1;
      *pDestLimit = (byte)((ushort)UVar1 >> 6) | 0xc0;
      pDestLimit = pDestLimit + 2;
      *pbVar7 = bVar3 & 0x3f | 0x80;
      _subchar_local = pUVar6;
    }
    else if ((uVar4 < 0xd800) || (0xdfff < uVar4)) {
      if ((long)local_78 - (long)pDestLimit < 3) {
        ch2 = 3;
        _subchar_local = pUVar6;
        break;
      }
      *pDestLimit = (byte)((ushort)UVar1 >> 0xc) | 0xe0;
      pbVar7 = pDestLimit + 2;
      pDestLimit[1] = (byte)((ushort)UVar1 >> 6) & 0x3f | 0x80;
      pDestLimit = pDestLimit + 3;
      *pbVar7 = bVar3 & 0x3f | 0x80;
      _subchar_local = pUVar6;
    }
    else {
      if (((UVar1 & 0x400U) == 0) && (((ushort)*pUVar6 & 0xfffffc00) == 0xdc00)) {
        local_40 = uVar4 * 0x400 + (uint)(ushort)*pUVar6 + 0xfca02400;
        _subchar_local = _subchar_local + 2;
      }
      else {
        if (subchar < 0) {
          *pErrorCode = U_INVALID_CHAR_FOUND;
          return (char *)0x0;
        }
        pSrcLimit._4_4_ = pSrcLimit._4_4_ + 1;
        local_40 = subchar;
        _subchar_local = pUVar6;
      }
      if (local_40 < 0x80) {
        local_7c = 1;
      }
      else {
        if (local_40 < 0x800) {
          local_80 = 2;
        }
        else {
          if (local_40 < 0xd800) {
            local_84 = 3;
          }
          else {
            if ((local_40 < 0xe000) || (0x10ffff < local_40)) {
              local_88 = 0;
            }
            else {
              local_88 = 4;
              if (local_40 < 0x10000) {
                local_88 = 3;
              }
            }
            local_84 = local_88;
          }
          local_80 = local_84;
        }
        local_7c = local_80;
      }
      if ((long)local_78 - (long)pDestLimit < (long)(int)local_7c) {
        ch2 = local_7c;
        break;
      }
      pDestLimit = _appendUTF8(pDestLimit,local_40);
    }
  }
  while( true ) {
    pUVar6 = _subchar_local + 1;
    UVar1 = *_subchar_local;
    if (UVar1 == L'\0') break;
    if ((ushort)UVar1 < 0x80) {
      ch2 = ch2 + 1;
      _subchar_local = pUVar6;
    }
    else if ((ushort)UVar1 < 0x800) {
      ch2 = ch2 + 2;
      _subchar_local = pUVar6;
    }
    else if ((UVar1 & 0xf800U) == 0xd800) {
      if (((UVar1 & 0x400U) == 0) && ((*pUVar6 & 0xfc00U) == 0xdc00)) {
        ch2 = ch2 + 4;
        _subchar_local = _subchar_local + 2;
      }
      else {
        if (subchar < 0) {
          *pErrorCode = U_INVALID_CHAR_FOUND;
          return (char *)0x0;
        }
        if ((uint)subchar < 0x80) {
          local_8c = 1;
        }
        else {
          if ((uint)subchar < 0x800) {
            local_90 = 2;
          }
          else {
            if ((uint)subchar < 0xd800) {
              local_94 = 3;
            }
            else {
              if (((uint)subchar < 0xe000) || (0x10ffff < (uint)subchar)) {
                local_98 = 0;
              }
              else {
                local_98 = 4;
                if ((uint)subchar < 0x10000) {
                  local_98 = 3;
                }
              }
              local_94 = local_98;
            }
            local_90 = local_94;
          }
          local_8c = local_90;
        }
        ch2 = local_8c + ch2;
        pSrcLimit._4_4_ = pSrcLimit._4_4_ + 1;
        _subchar_local = pUVar6;
      }
    }
    else {
      ch2 = ch2 + 3;
      _subchar_local = pUVar6;
    }
  }
LAB_003aafb4:
  iVar5 = ((int)pDestLimit - (int)dest) + ch2;
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = pSrcLimit._4_4_;
  }
  if (pDestLength != (int32_t *)0x0) {
    *pDestLength = iVar5;
  }
  u_terminateChars_63(dest,destCapacity,iVar5,pErrorCode);
  return dest;
LAB_003aab66:
  if (_subchar_local < local_a0) {
    pUVar6 = _subchar_local + 1;
    UVar1 = *_subchar_local;
    uVar4 = (uint)(ushort)UVar1;
    bVar3 = (byte)UVar1;
    if (uVar4 < 0x80) {
      if (local_78 <= pDestLimit) {
        ch2 = 1;
        _subchar_local = pUVar6;
        goto LAB_003aae20;
      }
      *pDestLimit = bVar3;
      pDestLimit = pDestLimit + 1;
      _subchar_local = pUVar6;
    }
    else if (uVar4 < 0x800) {
      if ((long)local_78 - (long)pDestLimit < 2) {
        ch2 = 2;
        _subchar_local = pUVar6;
        goto LAB_003aae20;
      }
      pbVar7 = pDestLimit + 1;
      *pDestLimit = (byte)((ushort)UVar1 >> 6) | 0xc0;
      pDestLimit = pDestLimit + 2;
      *pbVar7 = bVar3 & 0x3f | 0x80;
      _subchar_local = pUVar6;
    }
    else if ((uVar4 < 0xd800) || (0xdfff < uVar4)) {
      if ((long)local_78 - (long)pDestLimit < 3) {
        ch2 = 3;
        _subchar_local = pUVar6;
        goto LAB_003aae20;
      }
      *pDestLimit = (byte)((ushort)UVar1 >> 0xc) | 0xe0;
      pbVar7 = pDestLimit + 2;
      pDestLimit[1] = (byte)((ushort)UVar1 >> 6) & 0x3f | 0x80;
      pDestLimit = pDestLimit + 3;
      *pbVar7 = bVar3 & 0x3f | 0x80;
      _subchar_local = pUVar6;
    }
    else {
      if ((((UVar1 & 0x400U) == 0) && (pUVar6 < local_a0)) &&
         (((ushort)*pUVar6 & 0xfffffc00) == 0xdc00)) {
        local_40 = uVar4 * 0x400 + (uint)(ushort)*pUVar6 + 0xfca02400;
        _subchar_local = _subchar_local + 2;
      }
      else {
        if (subchar < 0) {
          *pErrorCode = U_INVALID_CHAR_FOUND;
          return (char *)0x0;
        }
        pSrcLimit._4_4_ = pSrcLimit._4_4_ + 1;
        local_40 = subchar;
        _subchar_local = pUVar6;
      }
      if (local_40 < 0x80) {
        local_a4 = 1;
      }
      else {
        if (local_40 < 0x800) {
          local_a8 = 2;
        }
        else {
          if (local_40 < 0xd800) {
            local_ac = 3;
          }
          else {
            if ((local_40 < 0xe000) || (0x10ffff < local_40)) {
              local_b0 = 0;
            }
            else {
              local_b0 = 4;
              if (local_40 < 0x10000) {
                local_b0 = 3;
              }
            }
            local_ac = local_b0;
          }
          local_a8 = local_ac;
        }
        local_a4 = local_a8;
      }
      if ((long)local_78 - (long)pDestLimit < (long)(int)local_a4) {
        ch2 = local_a4;
        goto LAB_003aae20;
      }
      pDestLimit = _appendUTF8(pDestLimit,local_40);
    }
    goto LAB_003aab66;
  }
LAB_003aae20:
  while (_subchar_local < local_a0) {
    pUVar6 = _subchar_local + 1;
    UVar1 = *_subchar_local;
    if ((ushort)UVar1 < 0x80) {
      ch2 = ch2 + 1;
      _subchar_local = pUVar6;
    }
    else if ((ushort)UVar1 < 0x800) {
      ch2 = ch2 + 2;
      _subchar_local = pUVar6;
    }
    else if ((UVar1 & 0xf800U) == 0xd800) {
      if ((((UVar1 & 0x400U) == 0) && (pUVar6 < local_a0)) && ((*pUVar6 & 0xfc00U) == 0xdc00)) {
        ch2 = ch2 + 4;
        _subchar_local = _subchar_local + 2;
      }
      else {
        if (subchar < 0) {
          *pErrorCode = U_INVALID_CHAR_FOUND;
          return (char *)0x0;
        }
        if ((uint)subchar < 0x80) {
          local_b4 = 1;
        }
        else {
          if ((uint)subchar < 0x800) {
            local_b8 = 2;
          }
          else {
            if ((uint)subchar < 0xd800) {
              local_bc = 3;
            }
            else {
              if (((uint)subchar < 0xe000) || (0x10ffff < (uint)subchar)) {
                local_c0 = 0;
              }
              else {
                local_c0 = 4;
                if ((uint)subchar < 0x10000) {
                  local_c0 = 3;
                }
              }
              local_bc = local_c0;
            }
            local_b8 = local_bc;
          }
          local_b4 = local_b8;
        }
        ch2 = local_b4 + ch2;
        pSrcLimit._4_4_ = pSrcLimit._4_4_ + 1;
        _subchar_local = pUVar6;
      }
    }
    else {
      ch2 = ch2 + 3;
      _subchar_local = pUVar6;
    }
  }
  goto LAB_003aafb4;
}

Assistant:

U_CAPI char* U_EXPORT2 
u_strToUTF8WithSub(char *dest,
            int32_t destCapacity,
            int32_t *pDestLength,
            const UChar *pSrc,
            int32_t srcLength,
            UChar32 subchar, int32_t *pNumSubstitutions,
            UErrorCode *pErrorCode){
    int32_t reqLength=0;
    uint32_t ch=0,ch2=0;
    uint8_t *pDest = (uint8_t *)dest;
    uint8_t *pDestLimit = (pDest!=NULL)?(pDest + destCapacity):NULL;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
        
    if( (pSrc==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    numSubstitutions=0;

    if(srcLength==-1) {
        while((ch=*pSrc)!=0) {
            ++pSrc;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                /*need not check for NUL because NUL fails U16_IS_TRAIL() anyway*/
                if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while((ch=*pSrc++)!=0) {
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    } else {
        const UChar *pSrcLimit = (pSrc!=NULL)?(pSrc+srcLength):NULL;
        int32_t count;

        /* Faster loop without ongoing checking for pSrcLimit and pDestLimit. */
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            count = (int32_t)((pDestLimit - pDest) / 3);
            srcLength = (int32_t)(pSrcLimit - pSrc);
            if(count > srcLength) {
                count = srcLength; /* min(remaining dest/3, remaining src) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }
            do {
                ch=*pSrc++;
                if(ch <= 0x7f) {
                    *pDest++ = (uint8_t)ch;
                } else if(ch <= 0x7ff) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else if(ch <= 0xd7ff || ch >= 0xe000) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else /* ch is a surrogate */ {
                    /*
                     * We will read two UChars and probably output four bytes,
                     * which we didn't account for with computing count,
                     * so we adjust it here.
                     */
                    if(--count == 0) {
                        --pSrc; /* undo ch=*pSrc++ for the lead surrogate */
                        break;  /* recompute count */
                    }

                    if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                        ++pSrc;
                        ch=U16_GET_SUPPLEMENTARY(ch, ch2);

                        /* writing 4 bytes per 2 UChars is ok */
                        *pDest++=(uint8_t)((ch>>18)|0xf0);
                        *pDest++=(uint8_t)(((ch>>12)&0x3f)|0x80);
                        *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                        *pDest++=(uint8_t)((ch&0x3f)|0x80);
                    } else  {
                        /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                        if(subchar>=0) {
                            ch=subchar;
                            ++numSubstitutions;
                        } else {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        }

                        /* convert and append*/
                        pDest=_appendUTF8(pDest, ch);
                    }
                }
            } while(--count > 0);
        }

        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    }

    reqLength+=(int32_t)(pDest - (uint8_t *)dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}